

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_HermiteSurface::IsValid(ON_HermiteSurface *this)

{
  bool bVar1;
  ON_SimpleArray<ON_3dPoint> *pOVar2;
  ON_SimpleArray<ON_3dVector> *pOVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (0 < (this->m_u_parameters).m_count) {
    lVar7 = 0;
    do {
      bVar1 = ON_IsValid((this->m_u_parameters).m_a[lVar7]);
      if (!bVar1) {
        return false;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->m_u_parameters).m_count);
  }
  if (0 < (this->m_v_parameters).m_count) {
    lVar7 = 0;
    do {
      bVar1 = ON_IsValid((this->m_v_parameters).m_a[lVar7]);
      if (!bVar1) {
        return false;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->m_v_parameters).m_count);
  }
  iVar4 = (this->m_grid_points).m_count;
  if (0 < iVar4) {
    pOVar2 = (this->m_grid_points).m_a;
    lVar7 = 0;
    do {
      if (0 < pOVar2[lVar7].m_count) {
        lVar5 = 0;
        lVar6 = 0;
        do {
          bVar1 = ON_3dPoint::IsUnset((ON_3dPoint *)((long)&(pOVar2[lVar7].m_a)->x + lVar5));
          if (bVar1) {
            return false;
          }
          lVar6 = lVar6 + 1;
          pOVar2 = (this->m_grid_points).m_a;
          lVar5 = lVar5 + 0x18;
        } while (lVar6 < pOVar2[lVar7].m_count);
        iVar4 = (this->m_grid_points).m_count;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  iVar4 = (this->m_u_tangents).m_count;
  if (0 < iVar4) {
    pOVar3 = (this->m_u_tangents).m_a;
    lVar7 = 0;
    do {
      if (0 < pOVar3[lVar7].m_count) {
        lVar5 = 0;
        lVar6 = 0;
        do {
          bVar1 = ON_3dVector::IsUnset((ON_3dVector *)((long)&(pOVar3[lVar7].m_a)->x + lVar5));
          if (bVar1) {
            return false;
          }
          lVar6 = lVar6 + 1;
          pOVar3 = (this->m_u_tangents).m_a;
          lVar5 = lVar5 + 0x18;
        } while (lVar6 < pOVar3[lVar7].m_count);
        iVar4 = (this->m_u_tangents).m_count;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  iVar4 = (this->m_v_tangents).m_count;
  if (0 < iVar4) {
    pOVar3 = (this->m_v_tangents).m_a;
    lVar7 = 0;
    do {
      if (0 < pOVar3[lVar7].m_count) {
        lVar5 = 0;
        lVar6 = 0;
        do {
          bVar1 = ON_3dVector::IsUnset((ON_3dVector *)((long)&(pOVar3[lVar7].m_a)->x + lVar5));
          if (bVar1) {
            return false;
          }
          lVar6 = lVar6 + 1;
          pOVar3 = (this->m_v_tangents).m_a;
          lVar5 = lVar5 + 0x18;
        } while (lVar6 < pOVar3[lVar7].m_count);
        iVar4 = (this->m_v_tangents).m_count;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  iVar4 = (this->m_twists).m_count;
  pOVar3 = (this->m_twists).m_a;
  if (0 < iVar4) {
    lVar7 = 0;
    do {
      if (0 < pOVar3[lVar7].m_count) {
        lVar5 = 0;
        lVar6 = 0;
        do {
          bVar1 = ON_3dVector::IsUnset((ON_3dVector *)((long)&(pOVar3[lVar7].m_a)->x + lVar5));
          if (bVar1) {
            return false;
          }
          lVar6 = lVar6 + 1;
          pOVar3 = (this->m_twists).m_a;
          lVar5 = lVar5 + 0x18;
        } while (lVar6 < pOVar3[lVar7].m_count);
        iVar4 = (this->m_twists).m_count;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  bVar1 = ValidateHermiteData((ON_SimpleArray<double> *)(this->m_u_parameters).m_a,
                              (ON_SimpleArray<double> *)(ulong)(uint)(this->m_u_parameters).m_count,
                              (ON_ClassArray<ON_SimpleArray<ON_3dPoint>_> *)
                              (this->m_v_parameters).m_a,
                              (ON_ClassArray<ON_SimpleArray<ON_3dVector>_> *)
                              (ulong)(uint)(this->m_v_parameters).m_count,
                              (ON_ClassArray<ON_SimpleArray<ON_3dVector>_> *)
                              (this->m_grid_points).m_a,
                              (ON_ClassArray<ON_SimpleArray<ON_3dVector>_> *)
                              (ulong)(uint)(this->m_grid_points).m_count);
  return bVar1;
}

Assistant:

bool ON_HermiteSurface::IsValid() const
{
  for (int i = 0; i < m_u_parameters.Count(); i++)
  {
    if (!ON_IsValid(m_u_parameters[i]))
      return false;
  }

  for (int i = 0; i < m_v_parameters.Count(); i++)
  {
    if (!ON_IsValid(m_v_parameters[i]))
      return false;
  }

  for (int i = 0; i < m_grid_points.Count(); i++)
  {
    for (int j = 0; j < m_grid_points[i].Count(); j++)
    {
      if (m_grid_points[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_u_tangents.Count(); i++)
  {
    for (int j = 0; j < m_u_tangents[i].Count(); j++)
    {
      if (m_u_tangents[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_v_tangents.Count(); i++)
  {
    for (int j = 0; j < m_v_tangents[i].Count(); j++)
    {
      if (m_v_tangents[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_twists.Count(); i++)
  {
    for (int j = 0; j < m_twists[i].Count(); j++)
    {
      if (m_twists[i][j].IsUnset())
        return false;
    }
  }
  
  return ValidateHermiteData(
    UParameters(),
    VParameters(),
    GridPoints(),
    UTangents(),
    VTangents(),
    Twists()
  );
}